

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.h
# Opt level: O0

CBoundary * __thiscall CLayer::GetBoundary(CLayer *this,int iX1,int iY1,int iX2,int iY2)

{
  int iVar1;
  int local_3c;
  int local_34;
  int iY2_local;
  int iX2_local;
  int iY1_local;
  int iX1_local;
  CLayer *this_local;
  
  if ((iX1 == iX2) && (iY1 == iY2)) {
    this_local = (CLayer *)0x0;
  }
  else {
    iVar1 = IsHorizontal(this);
    if ((iVar1 == 0) || (iY1 != iY2)) {
      iVar1 = IsVertical(this);
      if ((iVar1 == 0) || (iX1 != iX2)) {
        this_local = (CLayer *)0x0;
      }
      else {
        iVar1 = iY1 - iY2;
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        if (iVar1 != 1) {
          __assert_fail("abs(iY1-iY2)==1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.h"
                        ,0xb4,"CBoundary *CLayer::GetBoundary(int, int, int, int)");
        }
        local_3c = iY2;
        if (iY1 < iY2) {
          local_3c = iY1;
        }
        this_local = (CLayer *)GetBoundary(this,iX1,local_3c);
      }
    }
    else {
      iVar1 = iX1 - iX2;
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      if (iVar1 != 1) {
        __assert_fail("abs(iX1-iX2)==1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.h"
                      ,0xaf,"CBoundary *CLayer::GetBoundary(int, int, int, int)");
      }
      local_34 = iX2;
      if (iX1 < iX2) {
        local_34 = iX1;
      }
      this_local = (CLayer *)GetBoundary(this,local_34,iY1);
    }
  }
  return (CBoundary *)this_local;
}

Assistant:

inline CBoundary* CLayer::GetBoundary(int iX1, int iY1, int iX2, int iY2)
{
	if(iX1==iX2&&iY1==iY2)	return	NULL;

	if(IsHorizontal()&&iY1==iY2)
	{
		assert(abs(iX1-iX2)==1);
		return	GetBoundary(MIN(iX1,iX2),iY1);
	}
	else if(IsVertical()&&iX1==iX2)
	{
		assert(abs(iY1-iY2)==1);
		return	GetBoundary(iX1,MIN(iY1,iY2));
	}

	return	NULL;
}